

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitOutputTest.cpp
# Opt level: O2

void __thiscall
TEST_JUnitOutputTest_withOneTestGroupAndOneTestOnlyWriteToOneFile_Test::testBody
          (TEST_JUnitOutputTest_withOneTestGroupAndOneTestOnlyWriteToOneFile_Test *this)

{
  bool bVar1;
  int iVar2;
  JUnitTestOutputTestRunner *pJVar3;
  UtestShell *pUVar4;
  TestTerminator *pTVar5;
  
  pJVar3 = (this->super_TEST_GROUP_CppUTestGroupJUnitOutputTest).testCaseRunner;
  TestResult::testsStarted(&pJVar3->result_);
  pJVar3 = JUnitTestOutputTestRunner::withGroup(pJVar3,"groupname");
  pJVar3 = JUnitTestOutputTestRunner::withTest(pJVar3,"testname");
  JUnitTestOutputTestRunner::end(pJVar3);
  pUVar4 = UtestShell::getCurrent();
  iVar2 = FileSystemForJUnitTestOutputTests::amountOfFiles(&fileSystem);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0xe])
            (pUVar4,1,(long)iVar2,"LONGS_EQUAL(1, fileSystem.amountOfFiles()) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/JUnitOutputTest.cpp"
             ,0x16c,pTVar5);
  pUVar4 = UtestShell::getCurrent();
  bVar1 = FileSystemForJUnitTestOutputTests::fileExists(&fileSystem,"cpputest_groupname.xml");
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)bVar1,"CHECK","fileSystem.fileExists(\"cpputest_groupname.xml\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/JUnitOutputTest.cpp"
             ,0x16d,pTVar5);
  return;
}

Assistant:

TEST(JUnitOutputTest, withOneTestGroupAndOneTestOnlyWriteToOneFile)
{
    testCaseRunner->start()
            .withGroup("groupname").withTest("testname")
            .end();

    LONGS_EQUAL(1, fileSystem.amountOfFiles());
    CHECK(fileSystem.fileExists("cpputest_groupname.xml"));
}